

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O1

dynamic_bit_vector * bsim::xorr(dynamic_bit_vector *__return_storage_ptr__,dynamic_bit_vector *a)

{
  int iVar1;
  pointer puVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint6 uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [13];
  ushort uVar30;
  undefined1 in_XMM9 [16];
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 in_XMM13 [16];
  string local_30;
  uint uVar38;
  uint uVar39;
  
  iVar1 = a->N;
  if (0 < iVar1) {
    puVar2 = (a->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = iVar1 + -1;
    auVar25._4_4_ = iVar22;
    auVar25._0_4_ = iVar22;
    auVar25._8_4_ = iVar22;
    auVar25._12_4_ = iVar22;
    uVar23 = 0;
    auVar25 = auVar25 ^ _DAT_00192940;
    auVar28 = _DAT_00192930;
    auVar26 = (undefined1  [16])0x0;
    do {
      auVar32 = auVar26;
      auVar29 = in_XMM9._0_13_;
      auVar26 = auVar28 ^ _DAT_00192940;
      auVar27._0_4_ = -(uint)(auVar25._0_4_ < auVar26._0_4_);
      auVar27._4_4_ = -(uint)(auVar25._4_4_ < auVar26._4_4_);
      auVar27._8_4_ = -(uint)(auVar25._8_4_ < auVar26._8_4_);
      auVar27._12_4_ = -(uint)(auVar25._12_4_ < auVar26._12_4_);
      if ((~auVar27._0_4_ & 1) != 0) {
        auVar29 = ZEXT113(puVar2[uVar23 >> 3]);
      }
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = auVar27 ^ auVar33;
      if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        uVar24 = auVar29._0_4_;
        auVar29 = ZEXT413(uVar24 & 0xff000000 |
                          uVar24 & 0xff0000 | uVar24 & 0xff | (uint)puVar2[uVar23 >> 3] << 8);
      }
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar29 = ZEXT413(auVar29._0_4_ & 0xff000000 |
                          auVar29._0_4_ & 0xffff | (uint)puVar2[uVar23 >> 3] << 0x10);
      }
      if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar29 = ZEXT413(auVar29._0_4_ & 0xffffff | (uint)puVar2[uVar23 >> 3] << 0x18);
      }
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar29;
      auVar3[0xe] = auVar29[7];
      auVar5[0xc] = auVar29[6];
      auVar5._0_12_ = auVar29._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar29._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar8[10] = auVar29[5];
      auVar8._0_10_ = auVar29._0_10_;
      auVar8._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar29._0_9_;
      auVar11._10_5_ = auVar8._10_5_;
      auVar12[8] = auVar29[4];
      auVar12._0_8_ = auVar29._0_8_;
      auVar12._9_6_ = auVar11._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar12._8_7_;
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),auVar29[3]);
      auVar19._9_6_ = 0;
      auVar19._0_9_ = Var16;
      auVar17._1_10_ = SUB1510(auVar19 << 0x30,5);
      auVar17[0] = auVar29[2];
      auVar20._11_4_ = 0;
      auVar20._0_11_ = auVar17;
      auVar13[2] = auVar29[1];
      auVar13._0_2_ = auVar29._0_2_;
      auVar13._3_12_ = SUB1512(auVar20 << 0x20,3);
      auVar14._2_13_ = auVar13._2_13_;
      auVar14._0_2_ = auVar29._0_2_ & 0xff;
      uVar30 = (ushort)Var16;
      auVar4._10_2_ = 0;
      auVar4._0_10_ = auVar14._0_10_;
      auVar4._12_2_ = uVar30;
      uVar21 = CONCAT42(auVar4._10_4_,auVar17._0_2_);
      auVar18._6_8_ = 0;
      auVar18._0_6_ = uVar21;
      auVar9._4_2_ = auVar13._2_2_;
      auVar9._0_4_ = auVar14._0_4_;
      auVar9._6_8_ = SUB148(auVar18 << 0x40,6);
      uVar24 = auVar14._0_4_ & 0xffff;
      auVar34 = auVar28 & _DAT_00192950;
      auVar26 = pshuflw(auVar33,auVar34,0xfe);
      lVar31 = auVar26._0_8_;
      auVar37._0_4_ = uVar24 >> lVar31;
      uVar38 = auVar9._4_4_;
      auVar37._4_4_ = uVar38 >> lVar31;
      uVar39 = (uint)uVar21;
      auVar37._8_4_ = uVar39 >> lVar31;
      auVar37._12_2_ = uVar30 >> lVar31;
      auVar37._14_2_ = 0;
      auVar33 = pshuflw(in_XMM13,auVar34,0x54);
      auVar35._8_4_ = auVar34._8_4_;
      auVar35._12_4_ = auVar34._12_4_;
      auVar35._0_8_ = auVar34._8_8_;
      auVar26 = pshuflw(auVar37,auVar35,0xfe);
      lVar36 = auVar26._0_8_;
      auVar6._4_4_ = uVar38 >> lVar36;
      auVar6._0_4_ = uVar24 >> lVar36;
      auVar6._8_4_ = uVar39 >> lVar36;
      auVar6._12_2_ = uVar30 >> lVar36;
      in_XMM13._14_2_ = 0;
      in_XMM13._0_14_ = auVar6;
      auVar26 = pshuflw(auVar35,auVar35,0x54);
      lVar31 = auVar26._0_8_;
      auVar10._8_4_ = uVar39 >> lVar31;
      auVar10._0_8_ = (long)CONCAT64(uVar21,uVar38 >> lVar31) << 0x20;
      auVar10._12_2_ = uVar30 >> lVar31;
      in_XMM9._6_2_ = 0;
      in_XMM9._0_6_ = auVar10._8_6_;
      in_XMM9._8_6_ = auVar6._8_6_;
      in_XMM9._14_2_ = 0;
      auVar26._0_4_ = (uVar24 >> auVar33._0_8_) + auVar32._0_4_;
      auVar26._4_4_ = auVar37._4_4_ + auVar32._4_4_;
      auVar26._8_4_ = (uVar39 >> lVar31) + auVar32._8_4_;
      auVar26._12_4_ = (uint)(uVar30 >> lVar36) + auVar32._12_4_;
      uVar23 = uVar23 + 4;
      auVar34._0_4_ = auVar28._0_4_ + 4;
      auVar34._4_4_ = auVar28._4_4_ + 4;
      auVar34._8_4_ = auVar28._8_4_ + 4;
      auVar34._12_4_ = auVar28._12_4_ + 4;
      auVar28 = auVar34;
    } while ((iVar1 + 3U & 0xfffffffc) != uVar23);
    auVar28 = ~auVar27 & auVar26 | auVar32 & auVar27;
    if ((auVar28._12_4_ + auVar28._4_4_ + auVar28._8_4_ + auVar28._0_4_ & 1U) != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1","");
      dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
      goto LAB_001750dc;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"0","");
  dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
LAB_001750dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline dynamic_bit_vector
  xorr(const dynamic_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return dynamic_bit_vector(1, "0");
    }

    return dynamic_bit_vector(1, "1");
  }